

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_mpbe.c
# Opt level: O0

void gga_x_mpbe_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_x_mpbe_params *params;
  
  pvVar2 = malloc(0x20);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0x7a) {
    *puVar1 = 0x3fc4189374bc6a7f;
    puVar1[1] = 0x3fcc18e757928e0d;
    puVar1[2] = 0xbf8eb851eb851eb8;
    puVar1[3] = 0;
    return;
  }
  fprintf(_stderr,"Internal error in gga_x_mpbe\n");
  exit(1);
}

Assistant:

static void
gga_x_mpbe_init(xc_func_type *p)
{
  gga_x_mpbe_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_mpbe_params));
  params = (gga_x_mpbe_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_MPBE:
    params->a  =  0.157;
    params->c1 =  0.21951;
    params->c2 = -0.015;
    params->c3 =  0.0;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_mpbe\n");
    exit(1);
  }
}